

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_function.cpp
# Opt level: O0

bool __thiscall duckdb::Transformer::ExpressionIsEmptyStar(Transformer *this,ParsedExpression *expr)

{
  ExpressionClass EVar1;
  bool bVar2;
  StarExpression *pSVar3;
  BaseExpression *in_RSI;
  StarExpression *star;
  BaseExpression *in_stack_00000020;
  bool local_1;
  
  EVar1 = BaseExpression::GetExpressionClass(in_RSI);
  if (EVar1 == STAR) {
    pSVar3 = BaseExpression::Cast<duckdb::StarExpression>(in_stack_00000020);
    if ((((pSVar3->columns & 1U) == 0) &&
        (bVar2 = ::std::
                 unordered_set<duckdb::QualifiedColumnName,_duckdb::QualifiedColumnHashFunction,_duckdb::QualifiedColumnEquality,_std::allocator<duckdb::QualifiedColumnName>_>
                 ::empty((unordered_set<duckdb::QualifiedColumnName,_duckdb::QualifiedColumnHashFunction,_duckdb::QualifiedColumnEquality,_std::allocator<duckdb::QualifiedColumnName>_>
                          *)0x1a1844e), bVar2)) &&
       (bVar2 = ::std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
                ::empty((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>_>
                         *)0x1a18465), bVar2)) {
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Transformer::ExpressionIsEmptyStar(ParsedExpression &expr) {
	if (expr.GetExpressionClass() != ExpressionClass::STAR) {
		return false;
	}
	auto &star = expr.Cast<StarExpression>();
	if (!star.columns && star.exclude_list.empty() && star.replace_list.empty()) {
		return true;
	}
	return false;
}